

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O0

int ccall_get_results(lua_State *L,CTState *cts,CType *ct,CCallState *cc,int *ret)

{
  ulong uVar1;
  TValue *pTVar2;
  TValue *in_RCX;
  CCallState *in_RDX;
  CType *in_RSI;
  CTState *in_RDI;
  CTState *in_R8;
  void *dp_1;
  int rcl [2];
  void *dp;
  uint8_t *sp;
  CType *ctr;
  int local_44;
  CCallState *local_40;
  
  local_40 = in_RDX;
  do {
    local_40 = (CCallState *)(*(long *)in_RSI + (ulong)(*(uint *)&local_40->func & 0xffff) * 0x10);
  } while (*(uint *)&local_40->func >> 0x1c == 8);
  if (*(uint *)&local_40->func >> 0x1c == 4) {
    *(undefined4 *)&in_R8->tab = 0;
    local_44 = 0;
  }
  else {
    *(undefined4 *)&in_R8->tab = 1;
    if (*(uint *)&local_40->func >> 0x1c == 1) {
      if (*(char *)((long)in_RCX + 0xd) == '\0') {
        ccall_classify_struct
                  (in_R8,(CType *)local_40,(int *)&in_RCX[0x12].u64,
                   (CTSize)((ulong)in_RDI->g[-1].gcroot[0x24].gcptr32 + 8 >> 0x20));
        ccall_struct_ret(in_RDX,(int *)&in_RCX->u64,(uint8_t *)in_R8,
                         (CTSize)((ulong)local_40 >> 0x20));
      }
      local_44 = 1;
    }
    else if (((ulong)local_40->func & 0xf4000000) == 0x34000000) {
      uVar1 = (ulong)in_RDI->g[-1].gcroot[0x24].gcptr32;
      pTVar2 = (TValue *)(uVar1 + 8);
      if (*(CTSize *)((long)&local_40->func + 4) == 8) {
        *pTVar2 = in_RCX[2];
      }
      else {
        *pTVar2 = in_RCX[2];
        *(TValue *)(uVar1 + 0x10) = in_RCX[4];
      }
      local_44 = 1;
    }
    else {
      local_44 = lj_cconv_tv_ct(in_RDI,in_RSI,(CTypeID)((ulong)in_RDX >> 0x20),in_RCX,
                                (uint8_t *)in_R8);
    }
  }
  return local_44;
}

Assistant:

static int ccall_get_results(lua_State *L, CTState *cts, CType *ct,
			     CCallState *cc, int *ret)
{
  CType *ctr = ctype_rawchild(cts, ct);
  uint8_t *sp = (uint8_t *)&cc->gpr[0];
  if (ctype_isvoid(ctr->info)) {
    *ret = 0;  /* Zero results. */
    return 0;  /* No additional GC step. */
  }
  *ret = 1;  /* One result. */
  if (ctype_isstruct(ctr->info)) {
    /* Return cdata object which is already on top of stack. */
    if (!cc->retref) {
      void *dp = cdataptr(cdataV(L->top-1));  /* Use preallocated object. */
      CCALL_HANDLE_STRUCTRET2
    }
    return 1;  /* One GC step. */
  }
  if (ctype_iscomplex(ctr->info)) {
    /* Return cdata object which is already on top of stack. */
    void *dp = cdataptr(cdataV(L->top-1));  /* Use preallocated object. */
    CCALL_HANDLE_COMPLEXRET2
    return 1;  /* One GC step. */
  }
  if (LJ_BE && ctype_isinteger_or_bool(ctr->info) && ctr->size < CTSIZE_PTR)
    sp += (CTSIZE_PTR - ctr->size);
#if CCALL_NUM_FPR
  if (ctype_isfp(ctr->info) || ctype_isvector(ctr->info))
    sp = (uint8_t *)&cc->fpr[0];
#endif
#ifdef CCALL_HANDLE_RET
  CCALL_HANDLE_RET
#endif
  /* No reference types end up here, so there's no need for the CTypeID. */
  lua_assert(!(ctype_isrefarray(ctr->info) || ctype_isstruct(ctr->info)));
  return lj_cconv_tv_ct(cts, ctr, 0, L->top-1, sp);
}